

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregory_patch.h
# Opt level: O2

void __thiscall
embree::GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init_crackfix
          (GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,
          CatmullClarkPatch *patch,BezierCurve *border0,BezierCurve *border1,BezierCurve *border2,
          BezierCurve *border3)

{
  vfloat_impl<4> *e0_p_vtx;
  vfloat_impl<4> *e1_m_vtx;
  vfloat_impl<4> *e1_m_vtx_00;
  vfloat_impl<4> *e0_p_vtx_00;
  vfloat_impl<4> *e1_m_vtx_01;
  int iVar1;
  uint uVar2;
  uint face_valence_p1;
  uint face_valence_p1_00;
  uint face_valence_p3;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  vfloat_impl<4> *pvVar10;
  ulong uVar11;
  ulong uVar12;
  vfloat_impl<4> *pvVar13;
  vfloat_impl<4> *pvVar14;
  bool bVar15;
  float fVar16;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar23;
  undefined1 auVar24 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar36;
  
  if (ABS((patch->ring).items[0].vertex_crease_weight) == INFINITY) {
    auVar32 = *(undefined1 (*) [16])(patch->ring).items[0].vtx.field_0.v;
  }
  else {
    iVar1 = (patch->ring).items[0].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[0].face_valence;
      uVar9 = (ulong)(patch->ring).items[0].eval_start_index;
      pvVar10 = (patch->ring).items[0].ring.data + uVar9 * 2 + 1;
      fVar30 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar16 = 0.0;
      fVar20 = 0.0;
      fVar21 = 0.0;
      fVar22 = 0.0;
      uVar12 = uVar7;
      while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
        uVar11 = uVar7;
        if (uVar9 < uVar7) {
          uVar11 = 0;
        }
        pvVar14 = pvVar10 + uVar11 * -2;
        fVar30 = fVar30 + (pvVar14->field_0).v[0];
        fVar33 = fVar33 + (pvVar14->field_0).v[1];
        fVar34 = fVar34 + (pvVar14->field_0).v[2];
        fVar35 = fVar35 + (pvVar14->field_0).v[3];
        pvVar14 = pvVar10 + uVar11 * -2 + -1;
        fVar16 = fVar16 + (pvVar14->field_0).v[0];
        fVar20 = fVar20 + (pvVar14->field_0).v[1];
        fVar21 = fVar21 + (pvVar14->field_0).v[2];
        fVar22 = fVar22 + (pvVar14->field_0).v[3];
        pvVar10 = pvVar10 + 2;
        uVar9 = uVar9 + 1;
      }
      fVar23 = (float)uVar7;
      auVar18._0_4_ = (fVar23 + 5.0) * fVar23;
      fVar23 = fVar23 * fVar23;
      auVar31._0_4_ = fVar30 + fVar16 * 4.0 + fVar23 * (patch->ring).items[0].vtx.field_0.v[0];
      auVar31._4_4_ = fVar33 + fVar20 * 4.0 + fVar23 * (patch->ring).items[0].vtx.field_0.v[1];
      auVar31._8_4_ = fVar34 + fVar21 * 4.0 + fVar23 * (patch->ring).items[0].vtx.field_0.v[2];
      auVar31._12_4_ = fVar35 + fVar22 * 4.0 + fVar23 * (patch->ring).items[0].vtx.field_0.v[3];
      auVar18._4_4_ = auVar18._0_4_;
      auVar18._8_4_ = auVar18._0_4_;
      auVar18._12_4_ = auVar18._0_4_;
      auVar32 = divps(auVar31,auVar18);
    }
    else {
      uVar12 = 0;
      if ((int)(iVar1 + 2U) < (int)(patch->ring).items[0].edge_valence) {
        uVar12 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[0].ring.data;
      pvVar10 = pvVar14 + iVar1;
      pvVar14 = pvVar14 + uVar12;
      auVar32._0_4_ =
           (pvVar10->field_0).v[0] + (pvVar14->field_0).v[0] +
           (patch->ring).items[0].vtx.field_0.v[0] * 4.0;
      auVar32._4_4_ =
           (pvVar10->field_0).v[1] + (pvVar14->field_0).v[1] +
           (patch->ring).items[0].vtx.field_0.v[1] * 4.0;
      auVar32._8_4_ =
           (pvVar10->field_0).v[2] + (pvVar14->field_0).v[2] +
           (patch->ring).items[0].vtx.field_0.v[2] * 4.0;
      auVar32._12_4_ =
           (pvVar10->field_0).v[3] + (pvVar14->field_0).v[3] +
           (patch->ring).items[0].vtx.field_0.v[3] * 4.0;
      auVar32 = divps(auVar32,_DAT_01f4be90);
    }
  }
  *(undefined1 (*) [16])this->v[0][0].field_0.v = auVar32;
  if (ABS((patch->ring).items[1].vertex_crease_weight) == INFINITY) {
    aVar28 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(patch->ring).items[1].vtx.field_0.v;
  }
  else {
    iVar1 = (patch->ring).items[1].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[1].face_valence;
      uVar9 = (ulong)(patch->ring).items[1].eval_start_index;
      pvVar10 = (patch->ring).items[1].ring.data + uVar9 * 2 + 1;
      fVar16 = 0.0;
      fVar20 = 0.0;
      fVar21 = 0.0;
      fVar22 = 0.0;
      fVar30 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      uVar12 = uVar7;
      while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
        uVar11 = uVar7;
        if (uVar9 < uVar7) {
          uVar11 = 0;
        }
        pvVar14 = pvVar10 + uVar11 * -2;
        fVar30 = fVar30 + (pvVar14->field_0).v[0];
        fVar33 = fVar33 + (pvVar14->field_0).v[1];
        fVar34 = fVar34 + (pvVar14->field_0).v[2];
        fVar35 = fVar35 + (pvVar14->field_0).v[3];
        pvVar14 = pvVar10 + uVar11 * -2 + -1;
        fVar16 = fVar16 + (pvVar14->field_0).v[0];
        fVar20 = fVar20 + (pvVar14->field_0).v[1];
        fVar21 = fVar21 + (pvVar14->field_0).v[2];
        fVar22 = fVar22 + (pvVar14->field_0).v[3];
        pvVar10 = pvVar10 + 2;
        uVar9 = uVar9 + 1;
      }
      fVar23 = (float)uVar7;
      fVar36 = (fVar23 + 5.0) * fVar23;
      fVar23 = fVar23 * fVar23;
      auVar27._0_4_ = fVar30 + fVar16 * 4.0 + fVar23 * (patch->ring).items[1].vtx.field_0.v[0];
      auVar27._4_4_ = fVar33 + fVar20 * 4.0 + fVar23 * (patch->ring).items[1].vtx.field_0.v[1];
      auVar27._8_4_ = fVar34 + fVar21 * 4.0 + fVar23 * (patch->ring).items[1].vtx.field_0.v[2];
      auVar27._12_4_ = fVar35 + fVar22 * 4.0 + fVar23 * (patch->ring).items[1].vtx.field_0.v[3];
      auVar3._4_4_ = fVar36;
      auVar3._0_4_ = fVar36;
      auVar3._8_4_ = fVar36;
      auVar3._12_4_ = fVar36;
      aVar28 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)divps(auVar27,auVar3);
    }
    else {
      uVar12 = 0;
      if ((int)(iVar1 + 2U) < (int)(patch->ring).items[1].edge_valence) {
        uVar12 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[1].ring.data;
      pvVar10 = pvVar14 + iVar1;
      pvVar14 = pvVar14 + uVar12;
      auVar29._0_4_ =
           (pvVar10->field_0).v[0] + (pvVar14->field_0).v[0] +
           (patch->ring).items[1].vtx.field_0.v[0] * 4.0;
      auVar29._4_4_ =
           (pvVar10->field_0).v[1] + (pvVar14->field_0).v[1] +
           (patch->ring).items[1].vtx.field_0.v[1] * 4.0;
      auVar29._8_4_ =
           (pvVar10->field_0).v[2] + (pvVar14->field_0).v[2] +
           (patch->ring).items[1].vtx.field_0.v[2] * 4.0;
      auVar29._12_4_ =
           (pvVar10->field_0).v[3] + (pvVar14->field_0).v[3] +
           (patch->ring).items[1].vtx.field_0.v[3] * 4.0;
      aVar28 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)divps(auVar29,_DAT_01f4be90);
    }
  }
  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)this->v[0][3].field_0.v = aVar28;
  if (ABS((patch->ring).items[2].vertex_crease_weight) == INFINITY) {
    aVar25 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(patch->ring).items[2].vtx.field_0.v;
  }
  else {
    iVar1 = (patch->ring).items[2].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[2].face_valence;
      uVar9 = (ulong)(patch->ring).items[2].eval_start_index;
      pvVar10 = (patch->ring).items[2].ring.data + uVar9 * 2 + 1;
      fVar16 = 0.0;
      fVar20 = 0.0;
      fVar21 = 0.0;
      fVar22 = 0.0;
      fVar30 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      uVar12 = uVar7;
      while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
        uVar11 = uVar7;
        if (uVar9 < uVar7) {
          uVar11 = 0;
        }
        pvVar14 = pvVar10 + uVar11 * -2;
        fVar30 = fVar30 + (pvVar14->field_0).v[0];
        fVar33 = fVar33 + (pvVar14->field_0).v[1];
        fVar34 = fVar34 + (pvVar14->field_0).v[2];
        fVar35 = fVar35 + (pvVar14->field_0).v[3];
        pvVar14 = pvVar10 + uVar11 * -2 + -1;
        fVar16 = fVar16 + (pvVar14->field_0).v[0];
        fVar20 = fVar20 + (pvVar14->field_0).v[1];
        fVar21 = fVar21 + (pvVar14->field_0).v[2];
        fVar22 = fVar22 + (pvVar14->field_0).v[3];
        pvVar10 = pvVar10 + 2;
        uVar9 = uVar9 + 1;
      }
      fVar23 = (float)uVar7;
      fVar36 = (fVar23 + 5.0) * fVar23;
      fVar23 = fVar23 * fVar23;
      auVar24._0_4_ = fVar30 + fVar16 * 4.0 + fVar23 * (patch->ring).items[2].vtx.field_0.v[0];
      auVar24._4_4_ = fVar33 + fVar20 * 4.0 + fVar23 * (patch->ring).items[2].vtx.field_0.v[1];
      auVar24._8_4_ = fVar34 + fVar21 * 4.0 + fVar23 * (patch->ring).items[2].vtx.field_0.v[2];
      auVar24._12_4_ = fVar35 + fVar22 * 4.0 + fVar23 * (patch->ring).items[2].vtx.field_0.v[3];
      auVar4._4_4_ = fVar36;
      auVar4._0_4_ = fVar36;
      auVar4._8_4_ = fVar36;
      auVar4._12_4_ = fVar36;
      aVar25 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)divps(auVar24,auVar4);
    }
    else {
      uVar12 = 0;
      if ((int)(iVar1 + 2U) < (int)(patch->ring).items[2].edge_valence) {
        uVar12 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[2].ring.data;
      pvVar10 = pvVar14 + iVar1;
      pvVar14 = pvVar14 + uVar12;
      auVar26._0_4_ =
           (pvVar10->field_0).v[0] + (pvVar14->field_0).v[0] +
           (patch->ring).items[2].vtx.field_0.v[0] * 4.0;
      auVar26._4_4_ =
           (pvVar10->field_0).v[1] + (pvVar14->field_0).v[1] +
           (patch->ring).items[2].vtx.field_0.v[1] * 4.0;
      auVar26._8_4_ =
           (pvVar10->field_0).v[2] + (pvVar14->field_0).v[2] +
           (patch->ring).items[2].vtx.field_0.v[2] * 4.0;
      auVar26._12_4_ =
           (pvVar10->field_0).v[3] + (pvVar14->field_0).v[3] +
           (patch->ring).items[2].vtx.field_0.v[3] * 4.0;
      aVar25 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)divps(auVar26,_DAT_01f4be90);
    }
  }
  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)this->v[3][3].field_0.v = aVar25;
  if (ABS((patch->ring).items[3].vertex_crease_weight) == INFINITY) {
    auVar18 = *(undefined1 (*) [16])(patch->ring).items[3].vtx.field_0.v;
  }
  else {
    iVar1 = (patch->ring).items[3].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[3].face_valence;
      uVar9 = (ulong)(patch->ring).items[3].eval_start_index;
      pvVar10 = (patch->ring).items[3].ring.data + uVar9 * 2 + 1;
      fVar30 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar16 = 0.0;
      fVar20 = 0.0;
      fVar21 = 0.0;
      fVar22 = 0.0;
      uVar12 = uVar7;
      while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
        uVar11 = uVar7;
        if (uVar9 < uVar7) {
          uVar11 = 0;
        }
        pvVar14 = pvVar10 + uVar11 * -2;
        fVar16 = fVar16 + (pvVar14->field_0).v[0];
        fVar20 = fVar20 + (pvVar14->field_0).v[1];
        fVar21 = fVar21 + (pvVar14->field_0).v[2];
        fVar22 = fVar22 + (pvVar14->field_0).v[3];
        pvVar14 = pvVar10 + uVar11 * -2 + -1;
        fVar30 = fVar30 + (pvVar14->field_0).v[0];
        fVar33 = fVar33 + (pvVar14->field_0).v[1];
        fVar34 = fVar34 + (pvVar14->field_0).v[2];
        fVar35 = fVar35 + (pvVar14->field_0).v[3];
        pvVar10 = pvVar10 + 2;
        uVar9 = uVar9 + 1;
      }
      fVar23 = (float)uVar7;
      fVar36 = (fVar23 + 5.0) * fVar23;
      fVar23 = fVar23 * fVar23;
      auVar17._0_4_ = fVar16 + fVar30 * 4.0 + fVar23 * (patch->ring).items[3].vtx.field_0.v[0];
      auVar17._4_4_ = fVar20 + fVar33 * 4.0 + fVar23 * (patch->ring).items[3].vtx.field_0.v[1];
      auVar17._8_4_ = fVar21 + fVar34 * 4.0 + fVar23 * (patch->ring).items[3].vtx.field_0.v[2];
      auVar17._12_4_ = fVar22 + fVar35 * 4.0 + fVar23 * (patch->ring).items[3].vtx.field_0.v[3];
      auVar5._4_4_ = fVar36;
      auVar5._0_4_ = fVar36;
      auVar5._8_4_ = fVar36;
      auVar5._12_4_ = fVar36;
      auVar18 = divps(auVar17,auVar5);
    }
    else {
      uVar12 = 0;
      if ((int)(iVar1 + 2U) < (int)(patch->ring).items[3].edge_valence) {
        uVar12 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[3].ring.data;
      pvVar10 = pvVar14 + iVar1;
      pvVar14 = pvVar14 + uVar12;
      auVar19._0_4_ =
           (pvVar10->field_0).v[0] + (pvVar14->field_0).v[0] +
           (patch->ring).items[3].vtx.field_0.v[0] * 4.0;
      auVar19._4_4_ =
           (pvVar10->field_0).v[1] + (pvVar14->field_0).v[1] +
           (patch->ring).items[3].vtx.field_0.v[1] * 4.0;
      auVar19._8_4_ =
           (pvVar10->field_0).v[2] + (pvVar14->field_0).v[2] +
           (patch->ring).items[3].vtx.field_0.v[2] * 4.0;
      auVar19._12_4_ =
           (pvVar10->field_0).v[3] + (pvVar14->field_0).v[3] +
           (patch->ring).items[3].vtx.field_0.v[3] * 4.0;
      auVar18 = divps(auVar19,_DAT_01f4be90);
    }
  }
  *(undefined1 (*) [16])this->v[3][0].field_0.v = auVar18;
  if (ABS((patch->ring).items[0].vertex_crease_weight) == INFINITY) {
LAB_005c788d:
    pvVar10 = (patch->ring).items[0].ring.data;
    fVar20 = (pvVar10->field_0).v[0] - (patch->ring).items[0].vtx.field_0.v[0];
    fVar21 = (pvVar10->field_0).v[1] - (patch->ring).items[0].vtx.field_0.v[1];
    fVar22 = (pvVar10->field_0).v[2] - (patch->ring).items[0].vtx.field_0.v[2];
    fVar16 = (pvVar10->field_0).v[3] - (patch->ring).items[0].vtx.field_0.v[3];
  }
  else {
    iVar1 = (patch->ring).items[0].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[0].face_valence;
      uVar9 = (ulong)(patch->ring).items[0].eval_start_index;
      pvVar10 = (patch->ring).items[0].ring.data + uVar9 * 2 + 1;
      fVar20 = 0.0;
      fVar21 = 0.0;
      fVar22 = 0.0;
      fVar30 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar23 = 0.0;
      uVar12 = uVar7;
      while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
        uVar11 = uVar7;
        if (uVar9 < uVar7) {
          uVar11 = 0;
        }
        pvVar13 = pvVar10 + uVar11 * -2;
        fVar16 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x108
                                     ) + uVar11 * -4 + uVar9 * 4);
        pvVar14 = pvVar10 + uVar11 * -2 + -1;
        fVar36 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x310
                                     ) + uVar11 * -4 + uVar9 * 4);
        fVar33 = fVar33 + fVar16 * (pvVar14->field_0).v[0];
        fVar34 = fVar34 + fVar16 * (pvVar14->field_0).v[1];
        fVar35 = fVar35 + fVar16 * (pvVar14->field_0).v[2];
        fVar23 = fVar23 + fVar16 * (pvVar14->field_0).v[3];
        fVar20 = fVar20 + fVar36 * (pvVar13->field_0).v[0];
        fVar21 = fVar21 + fVar36 * (pvVar13->field_0).v[1];
        fVar22 = fVar22 + fVar36 * (pvVar13->field_0).v[2];
        fVar30 = fVar30 + fVar36 * (pvVar13->field_0).v[3];
        uVar9 = uVar9 + 1;
        pvVar10 = pvVar10 + 2;
      }
      fVar16 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar20 = fVar16 * (fVar20 + fVar33);
      fVar21 = fVar16 * (fVar21 + fVar34);
      fVar22 = fVar16 * (fVar22 + fVar35);
      fVar16 = fVar16 * (fVar30 + fVar23);
    }
    else {
      uVar2 = (patch->ring).items[0].edge_valence;
      if (iVar1 != uVar2 - 2) goto LAB_005c788d;
      uVar12 = 0;
      if ((int)(iVar1 + 2U) < (int)uVar2) {
        uVar12 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[0].ring.data;
      pvVar10 = pvVar14 + uVar12;
      pvVar14 = pvVar14 + iVar1;
      fVar20 = ((pvVar10->field_0).v[0] - (pvVar14->field_0).v[0]) * 0.5;
      fVar21 = ((pvVar10->field_0).v[1] - (pvVar14->field_0).v[1]) * 0.5;
      fVar22 = ((pvVar10->field_0).v[2] - (pvVar14->field_0).v[2]) * 0.5;
      fVar16 = ((pvVar10->field_0).v[3] - (pvVar14->field_0).v[3]) * 0.5;
    }
  }
  this->v[0][1].field_0.v[0] = fVar20 * 0.33333334 + auVar32._0_4_;
  this->v[0][1].field_0.v[1] = fVar21 * 0.33333334 + auVar32._4_4_;
  this->v[0][1].field_0.v[2] = fVar22 * 0.33333334 + auVar32._8_4_;
  this->v[0][1].field_0.v[3] = fVar16 * 0.33333334 + auVar32._12_4_;
  if (ABS((patch->ring).items[1].vertex_crease_weight) == INFINITY) {
LAB_005c78e2:
    pvVar10 = (patch->ring).items[1].ring.data;
    fVar20 = (pvVar10->field_0).v[0] - (patch->ring).items[1].vtx.field_0.v[0];
    fVar21 = (pvVar10->field_0).v[1] - (patch->ring).items[1].vtx.field_0.v[1];
    fVar22 = (pvVar10->field_0).v[2] - (patch->ring).items[1].vtx.field_0.v[2];
    fVar16 = (pvVar10->field_0).v[3] - (patch->ring).items[1].vtx.field_0.v[3];
  }
  else {
    iVar1 = (patch->ring).items[1].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[1].face_valence;
      uVar9 = (ulong)(patch->ring).items[1].eval_start_index;
      pvVar10 = (patch->ring).items[1].ring.data + uVar9 * 2 + 1;
      fVar20 = 0.0;
      fVar21 = 0.0;
      fVar22 = 0.0;
      fVar30 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar23 = 0.0;
      uVar12 = uVar7;
      while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
        uVar11 = uVar7;
        if (uVar9 < uVar7) {
          uVar11 = 0;
        }
        pvVar13 = pvVar10 + uVar11 * -2;
        fVar16 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x108
                                     ) + uVar11 * -4 + uVar9 * 4);
        pvVar14 = pvVar10 + uVar11 * -2 + -1;
        fVar36 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x310
                                     ) + uVar11 * -4 + uVar9 * 4);
        fVar33 = fVar33 + fVar16 * (pvVar14->field_0).v[0];
        fVar34 = fVar34 + fVar16 * (pvVar14->field_0).v[1];
        fVar35 = fVar35 + fVar16 * (pvVar14->field_0).v[2];
        fVar23 = fVar23 + fVar16 * (pvVar14->field_0).v[3];
        fVar20 = fVar20 + fVar36 * (pvVar13->field_0).v[0];
        fVar21 = fVar21 + fVar36 * (pvVar13->field_0).v[1];
        fVar22 = fVar22 + fVar36 * (pvVar13->field_0).v[2];
        fVar30 = fVar30 + fVar36 * (pvVar13->field_0).v[3];
        uVar9 = uVar9 + 1;
        pvVar10 = pvVar10 + 2;
      }
      fVar16 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar20 = fVar16 * (fVar20 + fVar33);
      fVar21 = fVar16 * (fVar21 + fVar34);
      fVar22 = fVar16 * (fVar22 + fVar35);
      fVar16 = fVar16 * (fVar30 + fVar23);
    }
    else {
      uVar2 = (patch->ring).items[1].edge_valence;
      if (iVar1 != uVar2 - 2) goto LAB_005c78e2;
      uVar12 = 0;
      if ((int)(iVar1 + 2U) < (int)uVar2) {
        uVar12 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[1].ring.data;
      pvVar10 = pvVar14 + uVar12;
      pvVar14 = pvVar14 + iVar1;
      fVar20 = ((pvVar10->field_0).v[0] - (pvVar14->field_0).v[0]) * 0.5;
      fVar21 = ((pvVar10->field_0).v[1] - (pvVar14->field_0).v[1]) * 0.5;
      fVar22 = ((pvVar10->field_0).v[2] - (pvVar14->field_0).v[2]) * 0.5;
      fVar16 = ((pvVar10->field_0).v[3] - (pvVar14->field_0).v[3]) * 0.5;
    }
  }
  this->v[1][3].field_0.v[0] = fVar20 * 0.33333334 + aVar28.v[0];
  this->v[1][3].field_0.v[1] = fVar21 * 0.33333334 + aVar28.v[1];
  this->v[1][3].field_0.v[2] = fVar22 * 0.33333334 + aVar28.v[2];
  this->v[1][3].field_0.v[3] = fVar16 * 0.33333334 + aVar28.v[3];
  if (ABS((patch->ring).items[2].vertex_crease_weight) == INFINITY) {
LAB_005c7937:
    pvVar10 = (patch->ring).items[2].ring.data;
    fVar20 = (pvVar10->field_0).v[0] - (patch->ring).items[2].vtx.field_0.v[0];
    fVar21 = (pvVar10->field_0).v[1] - (patch->ring).items[2].vtx.field_0.v[1];
    fVar22 = (pvVar10->field_0).v[2] - (patch->ring).items[2].vtx.field_0.v[2];
    fVar16 = (pvVar10->field_0).v[3] - (patch->ring).items[2].vtx.field_0.v[3];
  }
  else {
    iVar1 = (patch->ring).items[2].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[2].face_valence;
      uVar9 = (ulong)(patch->ring).items[2].eval_start_index;
      pvVar10 = (patch->ring).items[2].ring.data + uVar9 * 2 + 1;
      fVar20 = 0.0;
      fVar21 = 0.0;
      fVar22 = 0.0;
      fVar30 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar23 = 0.0;
      uVar12 = uVar7;
      while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
        uVar11 = uVar7;
        if (uVar9 < uVar7) {
          uVar11 = 0;
        }
        pvVar13 = pvVar10 + uVar11 * -2;
        fVar16 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x108
                                     ) + uVar11 * -4 + uVar9 * 4);
        pvVar14 = pvVar10 + uVar11 * -2 + -1;
        fVar36 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x310
                                     ) + uVar11 * -4 + uVar9 * 4);
        fVar33 = fVar33 + fVar16 * (pvVar14->field_0).v[0];
        fVar34 = fVar34 + fVar16 * (pvVar14->field_0).v[1];
        fVar35 = fVar35 + fVar16 * (pvVar14->field_0).v[2];
        fVar23 = fVar23 + fVar16 * (pvVar14->field_0).v[3];
        fVar20 = fVar20 + fVar36 * (pvVar13->field_0).v[0];
        fVar21 = fVar21 + fVar36 * (pvVar13->field_0).v[1];
        fVar22 = fVar22 + fVar36 * (pvVar13->field_0).v[2];
        fVar30 = fVar30 + fVar36 * (pvVar13->field_0).v[3];
        uVar9 = uVar9 + 1;
        pvVar10 = pvVar10 + 2;
      }
      fVar16 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar20 = fVar16 * (fVar20 + fVar33);
      fVar21 = fVar16 * (fVar21 + fVar34);
      fVar22 = fVar16 * (fVar22 + fVar35);
      fVar16 = fVar16 * (fVar30 + fVar23);
    }
    else {
      uVar2 = (patch->ring).items[2].edge_valence;
      if (iVar1 != uVar2 - 2) goto LAB_005c7937;
      uVar12 = 0;
      if ((int)(iVar1 + 2U) < (int)uVar2) {
        uVar12 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[2].ring.data;
      pvVar10 = pvVar14 + uVar12;
      pvVar14 = pvVar14 + iVar1;
      fVar20 = ((pvVar10->field_0).v[0] - (pvVar14->field_0).v[0]) * 0.5;
      fVar21 = ((pvVar10->field_0).v[1] - (pvVar14->field_0).v[1]) * 0.5;
      fVar22 = ((pvVar10->field_0).v[2] - (pvVar14->field_0).v[2]) * 0.5;
      fVar16 = ((pvVar10->field_0).v[3] - (pvVar14->field_0).v[3]) * 0.5;
    }
  }
  this->v[3][2].field_0.v[0] = fVar20 * 0.33333334 + aVar25.v[0];
  this->v[3][2].field_0.v[1] = fVar21 * 0.33333334 + aVar25.v[1];
  this->v[3][2].field_0.v[2] = fVar22 * 0.33333334 + aVar25.v[2];
  this->v[3][2].field_0.v[3] = fVar16 * 0.33333334 + aVar25.v[3];
  if (ABS((patch->ring).items[3].vertex_crease_weight) == INFINITY) {
LAB_005c798f:
    pvVar10 = (patch->ring).items[3].ring.data;
    fVar20 = (pvVar10->field_0).v[0] - (patch->ring).items[3].vtx.field_0.v[0];
    fVar21 = (pvVar10->field_0).v[1] - (patch->ring).items[3].vtx.field_0.v[1];
    fVar22 = (pvVar10->field_0).v[2] - (patch->ring).items[3].vtx.field_0.v[2];
    fVar16 = (pvVar10->field_0).v[3] - (patch->ring).items[3].vtx.field_0.v[3];
  }
  else {
    iVar1 = (patch->ring).items[3].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[3].face_valence;
      uVar9 = (ulong)(patch->ring).items[3].eval_start_index;
      pvVar10 = (patch->ring).items[3].ring.data + uVar9 * 2 + 1;
      fVar20 = 0.0;
      fVar21 = 0.0;
      fVar22 = 0.0;
      fVar30 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar23 = 0.0;
      uVar12 = uVar7;
      while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
        uVar11 = uVar7;
        if (uVar9 < uVar7) {
          uVar11 = 0;
        }
        pvVar13 = pvVar10 + uVar11 * -2;
        fVar16 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x108
                                     ) + uVar11 * -4 + uVar9 * 4);
        pvVar14 = pvVar10 + uVar11 * -2 + -1;
        fVar36 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x310
                                     ) + uVar11 * -4 + uVar9 * 4);
        fVar33 = fVar33 + fVar16 * (pvVar14->field_0).v[0];
        fVar34 = fVar34 + fVar16 * (pvVar14->field_0).v[1];
        fVar35 = fVar35 + fVar16 * (pvVar14->field_0).v[2];
        fVar23 = fVar23 + fVar16 * (pvVar14->field_0).v[3];
        fVar20 = fVar20 + fVar36 * (pvVar13->field_0).v[0];
        fVar21 = fVar21 + fVar36 * (pvVar13->field_0).v[1];
        fVar22 = fVar22 + fVar36 * (pvVar13->field_0).v[2];
        fVar30 = fVar30 + fVar36 * (pvVar13->field_0).v[3];
        uVar9 = uVar9 + 1;
        pvVar10 = pvVar10 + 2;
      }
      fVar16 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar20 = fVar16 * (fVar20 + fVar33);
      fVar21 = fVar16 * (fVar21 + fVar34);
      fVar22 = fVar16 * (fVar22 + fVar35);
      fVar16 = fVar16 * (fVar30 + fVar23);
    }
    else {
      uVar2 = (patch->ring).items[3].edge_valence;
      if (iVar1 != uVar2 - 2) goto LAB_005c798f;
      uVar12 = 0;
      if ((int)(iVar1 + 2U) < (int)uVar2) {
        uVar12 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[3].ring.data;
      pvVar10 = pvVar14 + uVar12;
      pvVar14 = pvVar14 + iVar1;
      fVar20 = ((pvVar10->field_0).v[0] - (pvVar14->field_0).v[0]) * 0.5;
      fVar21 = ((pvVar10->field_0).v[1] - (pvVar14->field_0).v[1]) * 0.5;
      fVar22 = ((pvVar10->field_0).v[2] - (pvVar14->field_0).v[2]) * 0.5;
      fVar16 = ((pvVar10->field_0).v[3] - (pvVar14->field_0).v[3]) * 0.5;
    }
  }
  this->v[2][0].field_0.v[0] = fVar20 * 0.33333334 + auVar18._0_4_;
  this->v[2][0].field_0.v[1] = fVar21 * 0.33333334 + auVar18._4_4_;
  this->v[2][0].field_0.v[2] = fVar22 * 0.33333334 + auVar18._8_4_;
  this->v[2][0].field_0.v[3] = fVar16 * 0.33333334 + auVar18._12_4_;
  if (ABS((patch->ring).items[0].vertex_crease_weight) == INFINITY) {
LAB_005c79d6:
    pvVar10 = (patch->ring).items[0].ring.data;
    fVar20 = pvVar10[2].field_0.v[0] - (patch->ring).items[0].vtx.field_0.v[0];
    fVar21 = pvVar10[2].field_0.v[1] - (patch->ring).items[0].vtx.field_0.v[1];
    fVar22 = pvVar10[2].field_0.v[2] - (patch->ring).items[0].vtx.field_0.v[2];
    fVar16 = pvVar10[2].field_0.v[3] - (patch->ring).items[0].vtx.field_0.v[3];
  }
  else {
    iVar1 = (patch->ring).items[0].border_index;
    if (iVar1 == -1) {
      uVar2 = (patch->ring).items[0].face_valence;
      uVar7 = (ulong)uVar2;
      uVar9 = (ulong)(patch->ring).items[0].eval_start_index;
      pvVar10 = (patch->ring).items[0].ring.data + uVar9 * 2 + 1;
      fVar20 = 0.0;
      fVar21 = 0.0;
      fVar22 = 0.0;
      fVar30 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar23 = 0.0;
      uVar12 = uVar7;
      while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
        uVar11 = uVar7;
        if (uVar9 < uVar7) {
          uVar11 = 0;
        }
        uVar8 = ~uVar11 + uVar9;
        if (uVar9 == uVar11) {
          uVar8 = (ulong)(uVar2 - 1);
        }
        pvVar13 = pvVar10 + uVar11 * -2;
        fVar16 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x108
                                     ) + uVar8 * 4);
        pvVar14 = pvVar10 + uVar11 * -2 + -1;
        fVar36 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x310
                                     ) + uVar8 * 4);
        fVar33 = fVar33 + fVar16 * (pvVar14->field_0).v[0];
        fVar34 = fVar34 + fVar16 * (pvVar14->field_0).v[1];
        fVar35 = fVar35 + fVar16 * (pvVar14->field_0).v[2];
        fVar23 = fVar23 + fVar16 * (pvVar14->field_0).v[3];
        fVar20 = fVar20 + fVar36 * (pvVar13->field_0).v[0];
        fVar21 = fVar21 + fVar36 * (pvVar13->field_0).v[1];
        fVar22 = fVar22 + fVar36 * (pvVar13->field_0).v[2];
        fVar30 = fVar30 + fVar36 * (pvVar13->field_0).v[3];
        uVar9 = uVar9 + 1;
        pvVar10 = pvVar10 + 2;
      }
      fVar16 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar20 = fVar16 * (fVar20 + fVar33);
      fVar21 = fVar16 * (fVar21 + fVar34);
      fVar22 = fVar16 * (fVar22 + fVar35);
      fVar16 = fVar16 * (fVar30 + fVar23);
    }
    else {
      if (iVar1 != 2) goto LAB_005c79d6;
      pvVar14 = (patch->ring).items[0].ring.data;
      pvVar10 = pvVar14 + (ulong)(4 < (int)(patch->ring).items[0].edge_valence) * 4;
      fVar20 = (pvVar14[2].field_0.v[0] - (pvVar10->field_0).v[0]) * 0.5;
      fVar21 = (pvVar14[2].field_0.v[1] - (pvVar10->field_0).v[1]) * 0.5;
      fVar22 = (pvVar14[2].field_0.v[2] - (pvVar10->field_0).v[2]) * 0.5;
      fVar16 = (pvVar14[2].field_0.v[3] - (pvVar10->field_0).v[3]) * 0.5;
    }
  }
  this->v[1][0].field_0.v[0] = auVar32._0_4_ + fVar20 * 0.33333334;
  this->v[1][0].field_0.v[1] = auVar32._4_4_ + fVar21 * 0.33333334;
  this->v[1][0].field_0.v[2] = auVar32._8_4_ + fVar22 * 0.33333334;
  this->v[1][0].field_0.v[3] = auVar32._12_4_ + fVar16 * 0.33333334;
  if (ABS((patch->ring).items[1].vertex_crease_weight) == INFINITY) {
LAB_005c7a1e:
    pvVar10 = (patch->ring).items[1].ring.data;
    fVar20 = pvVar10[2].field_0.v[0] - (patch->ring).items[1].vtx.field_0.v[0];
    fVar21 = pvVar10[2].field_0.v[1] - (patch->ring).items[1].vtx.field_0.v[1];
    fVar22 = pvVar10[2].field_0.v[2] - (patch->ring).items[1].vtx.field_0.v[2];
    fVar16 = pvVar10[2].field_0.v[3] - (patch->ring).items[1].vtx.field_0.v[3];
  }
  else {
    iVar1 = (patch->ring).items[1].border_index;
    if (iVar1 == -1) {
      uVar2 = (patch->ring).items[1].face_valence;
      uVar7 = (ulong)uVar2;
      uVar9 = (ulong)(patch->ring).items[1].eval_start_index;
      pvVar10 = (patch->ring).items[1].ring.data + uVar9 * 2 + 1;
      fVar20 = 0.0;
      fVar21 = 0.0;
      fVar22 = 0.0;
      fVar30 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar23 = 0.0;
      uVar12 = uVar7;
      while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
        uVar11 = uVar7;
        if (uVar9 < uVar7) {
          uVar11 = 0;
        }
        uVar8 = ~uVar11 + uVar9;
        if (uVar9 == uVar11) {
          uVar8 = (ulong)(uVar2 - 1);
        }
        pvVar13 = pvVar10 + uVar11 * -2;
        fVar16 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x108
                                     ) + uVar8 * 4);
        pvVar14 = pvVar10 + uVar11 * -2 + -1;
        fVar36 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x310
                                     ) + uVar8 * 4);
        fVar33 = fVar33 + fVar16 * (pvVar14->field_0).v[0];
        fVar34 = fVar34 + fVar16 * (pvVar14->field_0).v[1];
        fVar35 = fVar35 + fVar16 * (pvVar14->field_0).v[2];
        fVar23 = fVar23 + fVar16 * (pvVar14->field_0).v[3];
        fVar20 = fVar20 + fVar36 * (pvVar13->field_0).v[0];
        fVar21 = fVar21 + fVar36 * (pvVar13->field_0).v[1];
        fVar22 = fVar22 + fVar36 * (pvVar13->field_0).v[2];
        fVar30 = fVar30 + fVar36 * (pvVar13->field_0).v[3];
        uVar9 = uVar9 + 1;
        pvVar10 = pvVar10 + 2;
      }
      fVar16 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar20 = fVar16 * (fVar20 + fVar33);
      fVar21 = fVar16 * (fVar21 + fVar34);
      fVar22 = fVar16 * (fVar22 + fVar35);
      fVar16 = fVar16 * (fVar30 + fVar23);
    }
    else {
      if (iVar1 != 2) goto LAB_005c7a1e;
      pvVar14 = (patch->ring).items[1].ring.data;
      pvVar10 = pvVar14 + (ulong)(4 < (int)(patch->ring).items[1].edge_valence) * 4;
      fVar20 = (pvVar14[2].field_0.v[0] - (pvVar10->field_0).v[0]) * 0.5;
      fVar21 = (pvVar14[2].field_0.v[1] - (pvVar10->field_0).v[1]) * 0.5;
      fVar22 = (pvVar14[2].field_0.v[2] - (pvVar10->field_0).v[2]) * 0.5;
      fVar16 = (pvVar14[2].field_0.v[3] - (pvVar10->field_0).v[3]) * 0.5;
    }
  }
  this->v[0][2].field_0.v[0] = aVar28.v[0] + fVar20 * 0.33333334;
  this->v[0][2].field_0.v[1] = aVar28.v[1] + fVar21 * 0.33333334;
  this->v[0][2].field_0.v[2] = aVar28.v[2] + fVar22 * 0.33333334;
  this->v[0][2].field_0.v[3] = aVar28.v[3] + fVar16 * 0.33333334;
  if (ABS((patch->ring).items[2].vertex_crease_weight) != INFINITY) {
    iVar1 = (patch->ring).items[2].border_index;
    if (iVar1 == -1) {
      uVar2 = (patch->ring).items[2].face_valence;
      uVar7 = (ulong)uVar2;
      uVar9 = (ulong)(patch->ring).items[2].eval_start_index;
      pvVar10 = (patch->ring).items[2].ring.data + uVar9 * 2 + 1;
      fVar20 = 0.0;
      fVar21 = 0.0;
      fVar22 = 0.0;
      fVar30 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar23 = 0.0;
      uVar12 = uVar7;
      while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
        uVar11 = uVar7;
        if (uVar9 < uVar7) {
          uVar11 = 0;
        }
        uVar8 = ~uVar11 + uVar9;
        if (uVar9 == uVar11) {
          uVar8 = (ulong)(uVar2 - 1);
        }
        pvVar13 = pvVar10 + uVar11 * -2;
        fVar16 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x108
                                     ) + uVar8 * 4);
        pvVar14 = pvVar10 + uVar11 * -2 + -1;
        fVar36 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x310
                                     ) + uVar8 * 4);
        fVar33 = fVar33 + fVar16 * (pvVar14->field_0).v[0];
        fVar34 = fVar34 + fVar16 * (pvVar14->field_0).v[1];
        fVar35 = fVar35 + fVar16 * (pvVar14->field_0).v[2];
        fVar23 = fVar23 + fVar16 * (pvVar14->field_0).v[3];
        fVar20 = fVar20 + fVar36 * (pvVar13->field_0).v[0];
        fVar21 = fVar21 + fVar36 * (pvVar13->field_0).v[1];
        fVar22 = fVar22 + fVar36 * (pvVar13->field_0).v[2];
        fVar30 = fVar30 + fVar36 * (pvVar13->field_0).v[3];
        uVar9 = uVar9 + 1;
        pvVar10 = pvVar10 + 2;
      }
      fVar16 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar20 = fVar16 * (fVar20 + fVar33);
      fVar21 = fVar16 * (fVar21 + fVar34);
      fVar22 = fVar16 * (fVar22 + fVar35);
      fVar16 = fVar16 * (fVar30 + fVar23);
      goto LAB_005c738b;
    }
    if (iVar1 == 2) {
      pvVar14 = (patch->ring).items[2].ring.data;
      pvVar10 = pvVar14 + (ulong)(4 < (int)(patch->ring).items[2].edge_valence) * 4;
      fVar20 = (pvVar14[2].field_0.v[0] - (pvVar10->field_0).v[0]) * 0.5;
      fVar21 = (pvVar14[2].field_0.v[1] - (pvVar10->field_0).v[1]) * 0.5;
      fVar22 = (pvVar14[2].field_0.v[2] - (pvVar10->field_0).v[2]) * 0.5;
      fVar16 = (pvVar14[2].field_0.v[3] - (pvVar10->field_0).v[3]) * 0.5;
      goto LAB_005c738b;
    }
  }
  pvVar10 = (patch->ring).items[2].ring.data;
  fVar20 = pvVar10[2].field_0.v[0] - (patch->ring).items[2].vtx.field_0.v[0];
  fVar21 = pvVar10[2].field_0.v[1] - (patch->ring).items[2].vtx.field_0.v[1];
  fVar22 = pvVar10[2].field_0.v[2] - (patch->ring).items[2].vtx.field_0.v[2];
  fVar16 = pvVar10[2].field_0.v[3] - (patch->ring).items[2].vtx.field_0.v[3];
LAB_005c738b:
  this->v[2][3].field_0.v[0] = aVar25.v[0] + fVar20 * 0.33333334;
  this->v[2][3].field_0.v[1] = aVar25.v[1] + fVar21 * 0.33333334;
  this->v[2][3].field_0.v[2] = aVar25.v[2] + fVar22 * 0.33333334;
  this->v[2][3].field_0.v[3] = aVar25.v[3] + fVar16 * 0.33333334;
  if (ABS((patch->ring).items[3].vertex_crease_weight) == INFINITY) {
    pvVar10 = (patch->ring).items[3].ring.data;
    fVar20 = pvVar10[2].field_0.v[0] - (patch->ring).items[3].vtx.field_0.v[0];
    fVar21 = pvVar10[2].field_0.v[1] - (patch->ring).items[3].vtx.field_0.v[1];
    fVar22 = pvVar10[2].field_0.v[2] - (patch->ring).items[3].vtx.field_0.v[2];
    fVar16 = pvVar10[2].field_0.v[3] - (patch->ring).items[3].vtx.field_0.v[3];
  }
  else {
    iVar1 = (patch->ring).items[3].border_index;
    if (iVar1 == -1) {
      uVar2 = (patch->ring).items[3].face_valence;
      uVar7 = (ulong)uVar2;
      uVar9 = (ulong)(patch->ring).items[3].eval_start_index;
      pvVar10 = (patch->ring).items[3].ring.data + uVar9 * 2 + 1;
      fVar20 = 0.0;
      fVar21 = 0.0;
      fVar22 = 0.0;
      fVar30 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar23 = 0.0;
      uVar12 = uVar7;
      while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
        uVar11 = uVar7;
        if (uVar9 < uVar7) {
          uVar11 = 0;
        }
        uVar8 = ~uVar11 + uVar9;
        if (uVar9 == uVar11) {
          uVar8 = (ulong)(uVar2 - 1);
        }
        pvVar13 = pvVar10 + uVar11 * -2;
        fVar16 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x108
                                     ) + uVar8 * 4);
        pvVar14 = pvVar10 + uVar11 * -2 + -1;
        fVar36 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 8 + 0x310
                                     ) + uVar8 * 4);
        fVar33 = fVar33 + fVar16 * (pvVar14->field_0).v[0];
        fVar34 = fVar34 + fVar16 * (pvVar14->field_0).v[1];
        fVar35 = fVar35 + fVar16 * (pvVar14->field_0).v[2];
        fVar23 = fVar23 + fVar16 * (pvVar14->field_0).v[3];
        fVar20 = fVar20 + fVar36 * (pvVar13->field_0).v[0];
        fVar21 = fVar21 + fVar36 * (pvVar13->field_0).v[1];
        fVar22 = fVar22 + fVar36 * (pvVar13->field_0).v[2];
        fVar30 = fVar30 + fVar36 * (pvVar13->field_0).v[3];
        uVar9 = uVar9 + 1;
        pvVar10 = pvVar10 + 2;
      }
      fVar16 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar20 = fVar16 * (fVar20 + fVar33);
      fVar21 = fVar16 * (fVar21 + fVar34);
      fVar22 = fVar16 * (fVar22 + fVar35);
      fVar16 = fVar16 * (fVar30 + fVar23);
    }
    else if (iVar1 == 2) {
      pvVar14 = (patch->ring).items[3].ring.data;
      pvVar10 = pvVar14 + (ulong)(4 < (int)(patch->ring).items[3].edge_valence) * 4;
      fVar20 = (pvVar14[2].field_0.v[0] - (pvVar10->field_0).v[0]) * 0.5;
      fVar21 = (pvVar14[2].field_0.v[1] - (pvVar10->field_0).v[1]) * 0.5;
      fVar22 = (pvVar14[2].field_0.v[2] - (pvVar10->field_0).v[2]) * 0.5;
      fVar16 = (pvVar14[2].field_0.v[3] - (pvVar10->field_0).v[3]) * 0.5;
    }
    else {
      pvVar10 = (patch->ring).items[3].ring.data;
      fVar20 = pvVar10[2].field_0.v[0] - (patch->ring).items[3].vtx.field_0.v[0];
      fVar21 = pvVar10[2].field_0.v[1] - (patch->ring).items[3].vtx.field_0.v[1];
      fVar22 = pvVar10[2].field_0.v[2] - (patch->ring).items[3].vtx.field_0.v[2];
      fVar16 = pvVar10[2].field_0.v[3] - (patch->ring).items[3].vtx.field_0.v[3];
    }
  }
  this->v[3][1].field_0.v[0] = auVar18._0_4_ + fVar20 * 0.33333334;
  this->v[3][1].field_0.v[1] = auVar18._4_4_ + fVar21 * 0.33333334;
  this->v[3][1].field_0.v[2] = auVar18._8_4_ + fVar22 * 0.33333334;
  this->v[3][1].field_0.v[3] = auVar18._12_4_ + fVar16 * 0.33333334;
  if (border0 != (BezierCurve *)0x0) {
    uVar6 = *(undefined8 *)((long)&(border0->v0).field_0 + 8);
    *(undefined8 *)&this->v[0][0].field_0 = *(undefined8 *)&(border0->v0).field_0;
    *(undefined8 *)((long)&this->v[0][0].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border0->v1).field_0 + 8);
    *(undefined8 *)&this->v[0][1].field_0 = *(undefined8 *)&(border0->v1).field_0;
    *(undefined8 *)((long)&this->v[0][1].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border0->v2).field_0 + 8);
    *(undefined8 *)&this->v[0][2].field_0 = *(undefined8 *)&(border0->v2).field_0;
    *(undefined8 *)((long)&this->v[0][2].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border0->v3).field_0 + 8);
    *(undefined8 *)&this->v[0][3].field_0 = *(undefined8 *)&(border0->v3).field_0;
    *(undefined8 *)((long)&this->v[0][3].field_0 + 8) = uVar6;
  }
  pvVar10 = this->v[0] + 3;
  pvVar13 = this->v[3] + 3;
  pvVar14 = this->v[1] + 3;
  e1_m_vtx_00 = this->v[2] + 3;
  if (border1 != (BezierCurve *)0x0) {
    uVar6 = *(undefined8 *)((long)&(border1->v0).field_0 + 8);
    *(undefined8 *)&pvVar10->field_0 = *(undefined8 *)&(border1->v0).field_0;
    *(undefined8 *)((long)&this->v[0][3].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border1->v1).field_0 + 8);
    *(undefined8 *)&pvVar14->field_0 = *(undefined8 *)&(border1->v1).field_0;
    *(undefined8 *)((long)&this->v[1][3].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border1->v2).field_0 + 8);
    *(undefined8 *)&e1_m_vtx_00->field_0 = *(undefined8 *)&(border1->v2).field_0;
    *(undefined8 *)((long)&this->v[2][3].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border1->v3).field_0 + 8);
    *(undefined8 *)&pvVar13->field_0 = *(undefined8 *)&(border1->v3).field_0;
    *(undefined8 *)((long)&this->v[3][3].field_0 + 8) = uVar6;
  }
  e0_p_vtx_00 = this->v[3] + 2;
  e1_m_vtx_01 = this->v[3] + 1;
  if (border2 != (BezierCurve *)0x0) {
    uVar6 = *(undefined8 *)((long)&(border2->v0).field_0 + 8);
    *(undefined8 *)&pvVar13->field_0 = *(undefined8 *)&(border2->v0).field_0;
    *(undefined8 *)((long)&this->v[3][3].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border2->v1).field_0 + 8);
    *(undefined8 *)&e0_p_vtx_00->field_0 = *(undefined8 *)&(border2->v1).field_0;
    *(undefined8 *)((long)&this->v[3][2].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border2->v2).field_0 + 8);
    *(undefined8 *)&e1_m_vtx_01->field_0 = *(undefined8 *)&(border2->v2).field_0;
    *(undefined8 *)((long)&this->v[3][1].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border2->v3).field_0 + 8);
    *(undefined8 *)&this->v[3][0].field_0 = *(undefined8 *)&(border2->v3).field_0;
    *(undefined8 *)((long)&this->v[3][0].field_0 + 8) = uVar6;
  }
  e0_p_vtx = this->v[0] + 1;
  e1_m_vtx = this->v[0] + 2;
  if (border3 != (BezierCurve *)0x0) {
    uVar6 = *(undefined8 *)((long)&(border3->v0).field_0 + 8);
    *(undefined8 *)&this->v[3][0].field_0 = *(undefined8 *)&(border3->v0).field_0;
    *(undefined8 *)((long)&this->v[3][0].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border3->v1).field_0 + 8);
    *(undefined8 *)&this->v[2][0].field_0 = *(undefined8 *)&(border3->v1).field_0;
    *(undefined8 *)((long)&this->v[2][0].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border3->v2).field_0 + 8);
    *(undefined8 *)&this->v[1][0].field_0 = *(undefined8 *)&(border3->v2).field_0;
    *(undefined8 *)((long)&this->v[1][0].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border3->v3).field_0 + 8);
    *(undefined8 *)&this->v[0][0].field_0 = *(undefined8 *)&(border3->v3).field_0;
    *(undefined8 *)((long)&this->v[0][0].field_0 + 8) = uVar6;
  }
  uVar2 = (patch->ring).items[0].face_valence;
  face_valence_p1 = (patch->ring).items[1].face_valence;
  face_valence_p1_00 = (patch->ring).items[2].face_valence;
  face_valence_p3 = (patch->ring).items[3].face_valence;
  initFaceVertex(this,patch,0,(vfloat_impl<4> *)this,e0_p_vtx,e1_m_vtx,face_valence_p1,this->v[1],
                 this->v[2],face_valence_p3,this->v[1] + 1,this->f[0]);
  initFaceVertex(this,patch,1,pvVar10,pvVar14,e1_m_vtx_00,face_valence_p1_00,e1_m_vtx,e0_p_vtx,uVar2
                 ,this->v[1] + 2,this->f[0] + 1);
  initFaceVertex(this,patch,2,pvVar13,e0_p_vtx_00,e1_m_vtx_01,face_valence_p3,e1_m_vtx_00,pvVar14,
                 face_valence_p1,this->v[2] + 2,this->f[1] + 1);
  initFaceVertex(this,patch,3,this->v[3],this->v[2],this->v[1],uVar2,e1_m_vtx_01,e0_p_vtx_00,
                 face_valence_p3,this->v[2] + 1,this->f[1]);
  return;
}

Assistant:

__noinline void init_crackfix(const CatmullClarkPatch& patch, 
                                  const BezierCurve* border0, 
                                  const BezierCurve* border1,
                                  const BezierCurve* border2, 
                                  const BezierCurve* border3)
    {
      assert( patch.ring[0].hasValidPositions() );
      assert( patch.ring[1].hasValidPositions() );
      assert( patch.ring[2].hasValidPositions() );
      assert( patch.ring[3].hasValidPositions() );
      
      p0() = initCornerVertex(patch,0);
      p1() = initCornerVertex(patch,1);
      p2() = initCornerVertex(patch,2);
      p3() = initCornerVertex(patch,3);

      e0_p() = initPositiveEdgeVertex(patch,0, p0());
      e1_p() = initPositiveEdgeVertex(patch,1, p1());
      e2_p() = initPositiveEdgeVertex(patch,2, p2());
      e3_p() = initPositiveEdgeVertex(patch,3, p3());

      e0_m() = initNegativeEdgeVertex(patch,0, p0());
      e1_m() = initNegativeEdgeVertex(patch,1, p1());
      e2_m() = initNegativeEdgeVertex(patch,2, p2());
      e3_m() = initNegativeEdgeVertex(patch,3, p3());

      if (unlikely(border0 != nullptr)) 
      {         
        p0()   = border0->v0;
        e0_p() = border0->v1; 
        e1_m() = border0->v2; 
        p1()   = border0->v3;
      }
      
      if (unlikely(border1 != nullptr))
      {          
        p1()   = border1->v0; 
        e1_p() = border1->v1; 
        e2_m() = border1->v2; 
        p2()   = border1->v3; 
      }

      if (unlikely(border2 != nullptr))
      {          
        p2()   = border2->v0; 
        e2_p() = border2->v1; 
        e3_m() = border2->v2; 
        p3()   = border2->v3; 
      }

      if (unlikely(border3 != nullptr))
      {          
        p3()   = border3->v0; 
        e3_p() = border3->v1; 
        e0_m() = border3->v2; 
        p0()   = border3->v3; 
      }

      const unsigned int face_valence_p0 = patch.ring[0].face_valence;
      const unsigned int face_valence_p1 = patch.ring[1].face_valence;
      const unsigned int face_valence_p2 = patch.ring[2].face_valence;
      const unsigned int face_valence_p3 = patch.ring[3].face_valence;
      
      initFaceVertex(patch,0,p0(),e0_p(),e1_m(),face_valence_p1,e0_m(),e3_p(),face_valence_p3,f0_p(),f0_m() );
      initFaceVertex(patch,1,p1(),e1_p(),e2_m(),face_valence_p2,e1_m(),e0_p(),face_valence_p0,f1_p(),f1_m() );
      initFaceVertex(patch,2,p2(),e2_p(),e3_m(),face_valence_p3,e2_m(),e1_p(),face_valence_p1,f2_p(),f2_m() );
      initFaceVertex(patch,3,p3(),e3_p(),e0_m(),face_valence_p0,e3_m(),e2_p(),face_valence_p3,f3_p(),f3_m() );
    }